

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O0

char uprv_ebcdictolower_63(char c)

{
  undefined1 local_9;
  char c_local;
  
  if ((((0xc0 < (byte)c) && ((byte)c < 0xca)) || ((0xd0 < (byte)c && ((byte)c < 0xda)))) ||
     ((local_9 = c, 0xe1 < (byte)c && ((byte)c < 0xea)))) {
    local_9 = c + -0x40;
  }
  return local_9;
}

Assistant:

U_CAPI char U_EXPORT2
uprv_ebcdictolower(char c) {
    if( (0xc1<=(uint8_t)c && (uint8_t)c<=0xc9) ||
        (0xd1<=(uint8_t)c && (uint8_t)c<=0xd9) ||
        (0xe2<=(uint8_t)c && (uint8_t)c<=0xe9)
    ) {
        c=(char)(c-0x40);
    }
    return c;
}